

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btMultiBodyDynamicsWorld.cpp
# Opt level: O2

void __thiscall
btMultiBodyDynamicsWorld::solveConstraints
          (btMultiBodyDynamicsWorld *this,btContactSolverInfo *solverInfo)

{
  btScalar *pbVar1;
  btScalar *pbVar2;
  btMultiBody *pBody;
  btMultiBody *pBody_00;
  btMultiBody *pBody_01;
  btMultiBody *pBody_02;
  anon_struct_1_0_00000001 *this_00;
  anon_struct_1_0_00000001 *this_01;
  btScalar *pbVar3;
  anon_struct_1_0_00000001 *this_02;
  btAlignedObjectArray<btTypedConstraint_*> *this_03;
  float dt;
  uint uVar4;
  int iVar5;
  MultiBodyInplaceSolverIslandCallback *this_04;
  btConstraintSolver *pbVar6;
  btMultiBody *pbVar7;
  btMultibodyLink *pbVar8;
  float *pfVar9;
  int iVar10;
  int iVar11;
  uint uVar12;
  undefined4 extraout_var;
  int i;
  ulong uVar13;
  ulong uVar14;
  int i_4;
  long lVar15;
  btScalar *pData;
  btScalar *pData_00;
  btScalar *pData_01;
  int i_5;
  long lVar16;
  btTypedConstraint **sortedConstraints;
  int link;
  btMultiBodyConstraint **sortedMultiBodyConstraints;
  long lVar17;
  bool bVar18;
  float dt_00;
  CProfileSample __profile_1;
  CProfileSample __profile;
  btAlignedObjectArray<float> scratch_r;
  float local_124;
  btAlignedObjectArray<btMatrix3x3> scratch_m;
  btAlignedObjectArray<btVector3> scratch_v;
  btAlignedObjectArray<float> delta_q;
  btAlignedObjectArray<float> scratch_r2;
  btAlignedObjectArray<float> delta_qd;
  anon_struct_24_3_4afc6ef8 pResetQx;
  
  forwardKinematics(this);
  scratch_r.m_ownsMemory = true;
  scratch_r.m_data = (float *)0x0;
  scratch_r.m_size = 0;
  scratch_r.m_capacity = 0;
  scratch_v.m_ownsMemory = true;
  scratch_v.m_data = (btVector3 *)0x0;
  scratch_v.m_size = 0;
  scratch_v.m_capacity = 0;
  scratch_m.m_ownsMemory = true;
  scratch_m.m_data = (btMatrix3x3 *)0x0;
  scratch_m.m_size = 0;
  scratch_m.m_capacity = 0;
  CProfileManager::Start_Profile("solveConstraints");
  this_03 = &(this->super_btDiscreteDynamicsWorld).m_sortedConstraints;
  scratch_r2._0_4_ = 0;
  scratch_r2.m_size = 0;
  btAlignedObjectArray<btTypedConstraint_*>::resize
            (this_03,(this->super_btDiscreteDynamicsWorld).m_constraints.m_size,
             (btTypedConstraint **)&scratch_r2);
  lVar16 = 0;
  while( true ) {
    iVar10 = (*(this->super_btDiscreteDynamicsWorld).super_btDynamicsWorld.super_btCollisionWorld.
               _vptr_btCollisionWorld[0x1a])(this);
    if (iVar10 <= lVar16) break;
    (this->super_btDiscreteDynamicsWorld).m_sortedConstraints.m_data[lVar16] =
         (this->super_btDiscreteDynamicsWorld).m_constraints.m_data[lVar16];
    lVar16 = lVar16 + 1;
  }
  btAlignedObjectArray<btTypedConstraint_*>::quickSort<btSortConstraintOnIslandPredicate2>
            (this_03,(btSortConstraintOnIslandPredicate2 *)&scratch_r2);
  iVar10 = (*(this->super_btDiscreteDynamicsWorld).super_btDynamicsWorld.super_btCollisionWorld.
             _vptr_btCollisionWorld[0x1a])(this);
  if (iVar10 == 0) {
    sortedConstraints = (btTypedConstraint **)0x0;
  }
  else {
    sortedConstraints = (this->super_btDiscreteDynamicsWorld).m_sortedConstraints.m_data;
  }
  scratch_r2._0_4_ = 0;
  scratch_r2.m_size = 0;
  btAlignedObjectArray<btMultiBodyConstraint_*>::resize
            (&this->m_sortedMultiBodyConstraints,(this->m_multiBodyConstraints).m_size,
             (btMultiBodyConstraint **)&scratch_r2);
  uVar4 = (this->m_multiBodyConstraints).m_size;
  uVar13 = 0;
  uVar14 = (ulong)uVar4;
  if ((int)uVar4 < 1) {
    uVar14 = uVar13;
  }
  for (; uVar14 != uVar13; uVar13 = uVar13 + 1) {
    (this->m_sortedMultiBodyConstraints).m_data[uVar13] =
         (this->m_multiBodyConstraints).m_data[uVar13];
  }
  btAlignedObjectArray<btMultiBodyConstraint_*>::
  quickSort<btSortMultiBodyConstraintOnIslandPredicate>
            (&this->m_sortedMultiBodyConstraints,
             (btSortMultiBodyConstraintOnIslandPredicate *)&scratch_r2);
  iVar10 = (this->m_sortedMultiBodyConstraints).m_size;
  sortedMultiBodyConstraints = (this->m_sortedMultiBodyConstraints).m_data;
  this_04 = this->m_solverMultiBodyIslandCallback;
  iVar5 = (this->super_btDiscreteDynamicsWorld).m_sortedConstraints.m_size;
  iVar11 = (*(this->super_btDiscreteDynamicsWorld).super_btDynamicsWorld.super_btCollisionWorld.
             _vptr_btCollisionWorld[5])();
  if (iVar10 == 0) {
    sortedMultiBodyConstraints = (btMultiBodyConstraint **)0x0;
  }
  MultiBodyInplaceSolverIslandCallback::setup
            (this_04,solverInfo,sortedConstraints,iVar5,sortedMultiBodyConstraints,iVar10,
             (btIDebugDraw *)CONCAT44(extraout_var,iVar11));
  pbVar6 = (this->super_btDiscreteDynamicsWorld).m_constraintSolver;
  uVar4 = (this->super_btDiscreteDynamicsWorld).super_btDynamicsWorld.super_btCollisionWorld.
          m_collisionObjects.m_size;
  uVar12 = (*((this->super_btDiscreteDynamicsWorld).super_btDynamicsWorld.super_btCollisionWorld.
             m_dispatcher1)->_vptr_btDispatcher[9])();
  (*pbVar6->_vptr_btConstraintSolver[2])(pbVar6,(ulong)uVar4,(ulong)uVar12);
  btSimulationIslandManager::buildAndProcessIslands
            ((this->super_btDiscreteDynamicsWorld).m_islandManager,
             (this->super_btDiscreteDynamicsWorld).super_btDynamicsWorld.super_btCollisionWorld.
             m_dispatcher1,(btCollisionWorld *)this,
             &this->m_solverMultiBodyIslandCallback->super_IslandCallback);
  CProfileManager::Start_Profile("btMultiBody stepVelocities");
  lVar16 = 0;
  while( true ) {
    if ((this->m_multiBodies).m_size <= lVar16) break;
    pbVar7 = (this->m_multiBodies).m_data[lVar16];
    if (pbVar7->m_baseCollider == (btMultiBodyLinkCollider *)0x0) {
      bVar18 = false;
    }
    else {
      bVar18 = *(int *)(pbVar7->m_baseCollider + 0xec) == 2;
    }
    uVar4 = (pbVar7->m_links).m_size;
    uVar14 = 0;
    if (0 < (int)uVar4) {
      uVar14 = (ulong)uVar4;
    }
    for (lVar15 = 0; uVar14 * 600 - lVar15 != 0; lVar15 = lVar15 + 600) {
      lVar17 = *(long *)((long)((pbVar7->m_links).m_data)->m_jointTorque + lVar15 + 0x1c);
      if (lVar17 != 0) {
        bVar18 = (bool)(bVar18 | *(int *)(lVar17 + 0xec) == 2);
      }
    }
    if (!bVar18) {
      scratch_r2._0_4_ = 0;
      btAlignedObjectArray<float>::resize(&scratch_r,uVar4 + 1,(float *)&scratch_r2);
      btAlignedObjectArray<btVector3>::resize
                (&scratch_v,(pbVar7->m_links).m_size + 1,(btVector3 *)&scratch_r2);
      btAlignedObjectArray<btMatrix3x3>::resize
                (&scratch_m,(pbVar7->m_links).m_size + 1,(btMatrix3x3 *)&scratch_r2);
      if (pbVar7->m_useRK4 == false) {
        btMultiBody::computeAccelerationsArticulatedBodyAlgorithmMultiDof
                  (pbVar7,(solverInfo->super_btContactSolverInfoData).m_timeStep,&scratch_r,
                   &scratch_v,&scratch_m,false);
      }
      else {
        lVar15 = (long)pbVar7->m_dofCount;
        pbVar1 = (btScalar *)(lVar15 + 6);
        lVar17 = (long)pbVar7->m_posVarCnt + 7;
        scratch_r2.m_ownsMemory = true;
        scratch_r2.m_data = (float *)0x0;
        scratch_r2.m_size = 0;
        scratch_r2.m_capacity = 0;
        iVar10 = (int)pbVar1;
        delta_q._0_4_ = 0;
        btAlignedObjectArray<float>::resize
                  (&scratch_r2,iVar10 * 8 + (int)lVar17 * 2,(float *)&delta_q);
        pbVar2 = scratch_r2.m_data + lVar17;
        pBody = (btMultiBody *)(pbVar2 + lVar17);
        pBody_00 = (btMultiBody *)((pBody->m_basePos).m_floats + lVar15);
        pBody_01 = (btMultiBody *)((pBody_00->m_basePos).m_floats + lVar15);
        pBody_02 = (btMultiBody *)((pBody_01->m_basePos).m_floats + lVar15);
        this_00 = (anon_struct_1_0_00000001 *)((pBody_02->m_basePos).m_floats + lVar15);
        this_01 = this_00 + (long)pbVar1 * 4;
        this_02 = this_01 + (long)pbVar1 * 4;
        *scratch_r2.m_data = (pbVar7->m_baseQuat).super_btQuadWord.m_floats[0];
        scratch_r2.m_data[1] = (pbVar7->m_baseQuat).super_btQuadWord.m_floats[1];
        scratch_r2.m_data[2] = (pbVar7->m_baseQuat).super_btQuadWord.m_floats[2];
        scratch_r2.m_data[3] = (pbVar7->m_baseQuat).super_btQuadWord.m_floats[3];
        scratch_r2.m_data[4] = (pbVar7->m_basePos).m_floats[0];
        scratch_r2.m_data[5] = (pbVar7->m_basePos).m_floats[1];
        scratch_r2.m_data[6] = (pbVar7->m_basePos).m_floats[2];
        uVar4 = (pbVar7->m_links).m_size;
        if ((int)uVar4 < 1) {
          uVar4 = 0;
        }
        lVar17 = 0x1b0;
        for (uVar14 = 0; uVar14 != uVar4; uVar14 = uVar14 + 1) {
          pbVar8 = (pbVar7->m_links).m_data;
          uVar12 = pbVar8[uVar14].m_posVarCount;
          if (pbVar8[uVar14].m_posVarCount < 1) {
            uVar12 = 0;
          }
          for (uVar13 = 0; uVar12 != uVar13; uVar13 = uVar13 + 1) {
            scratch_r2.m_data[pbVar8[uVar14].m_cfgOffset + (int)uVar13 + 7] =
                 *(float *)((long)(pbVar8->m_inertiaLocal).m_floats + uVar13 * 4 + lVar17 + -4);
          }
          lVar17 = lVar17 + 600;
        }
        uVar14 = 0;
        if (0 < iVar10) {
          uVar14 = (ulong)pbVar1 & 0xffffffff;
        }
        for (uVar13 = 0; uVar14 != uVar13; uVar13 = uVar13 + 1) {
          (pBody->m_basePos).m_floats[uVar13 - 6] = (pbVar7->m_realBuf).m_data[uVar13];
        }
        pResetQx.scratch_q0 = scratch_r2.m_data;
        dt = (solverInfo->super_btContactSolverInfoData).m_timeStep;
        iVar11 = 0;
        pResetQx.bod = pbVar7;
        pResetQx.scratch_qx = pbVar2;
        btMultiBody::computeAccelerationsArticulatedBodyAlgorithmMultiDof
                  (pbVar7,0.0,&scratch_r,&scratch_v,&scratch_m,false);
        iVar5 = pbVar7->m_dofCount;
        for (uVar13 = 0; uVar14 != uVar13; uVar13 = uVar13 + 1) {
          *(float *)(this_00 + uVar13 * 4) = scratch_r.m_data[(long)iVar5 + uVar13];
        }
        solveConstraints::anon_struct_24_3_4afc6ef8::operator()(&pResetQx);
        dt_00 = dt * 0.5;
        btMultiBody::stepPositionsMultiDof(pbVar7,dt_00,pbVar2,(btScalar *)pBody);
        solveConstraints::anon_struct_1_0_00000001::operator()
                  (this_00,dt_00,(btScalar *)pBody,(btScalar *)pBody_00,pbVar1,iVar11);
        solveConstraints::anon_struct_1_0_00000001::operator()
                  ((anon_struct_1_0_00000001 *)pbVar7,pBody_00,pData);
        iVar11 = 0;
        btMultiBody::computeAccelerationsArticulatedBodyAlgorithmMultiDof
                  (pbVar7,0.0,&scratch_r,&scratch_v,&scratch_m,false);
        iVar5 = pbVar7->m_dofCount;
        for (uVar13 = 0; uVar14 != uVar13; uVar13 = uVar13 + 1) {
          *(float *)(this_01 + uVar13 * 4) = scratch_r.m_data[(long)iVar5 + uVar13];
        }
        solveConstraints::anon_struct_24_3_4afc6ef8::operator()(&pResetQx);
        btMultiBody::stepPositionsMultiDof(pbVar7,dt_00,pbVar2,(btScalar *)pBody_00);
        solveConstraints::anon_struct_1_0_00000001::operator()
                  (this_01,dt_00,(btScalar *)pBody,(btScalar *)pBody_01,pbVar1,iVar11);
        solveConstraints::anon_struct_1_0_00000001::operator()
                  ((anon_struct_1_0_00000001 *)pbVar7,pBody_01,pData_00);
        iVar11 = 0;
        btMultiBody::computeAccelerationsArticulatedBodyAlgorithmMultiDof
                  (pbVar7,0.0,&scratch_r,&scratch_v,&scratch_m,false);
        iVar5 = pbVar7->m_dofCount;
        for (uVar13 = 0; uVar14 != uVar13; uVar13 = uVar13 + 1) {
          *(float *)(this_02 + uVar13 * 4) = scratch_r.m_data[(long)iVar5 + uVar13];
        }
        solveConstraints::anon_struct_24_3_4afc6ef8::operator()(&pResetQx);
        btMultiBody::stepPositionsMultiDof(pbVar7,dt,pbVar2,(btScalar *)pBody_01);
        solveConstraints::anon_struct_1_0_00000001::operator()
                  (this_02,dt,(btScalar *)pBody,(btScalar *)pBody_02,pbVar1,iVar11);
        solveConstraints::anon_struct_1_0_00000001::operator()
                  ((anon_struct_1_0_00000001 *)pbVar7,pBody_02,pData_01);
        btMultiBody::computeAccelerationsArticulatedBodyAlgorithmMultiDof
                  (pbVar7,0.0,&scratch_r,&scratch_v,&scratch_m,false);
        iVar5 = pbVar7->m_dofCount;
        for (uVar13 = 0; uVar14 != uVar13; uVar13 = uVar13 + 1) {
          *(float *)(this_02 + uVar13 * 4 + (long)pbVar1 * 4) =
               scratch_r.m_data[(long)iVar5 + uVar13];
        }
        delta_q.m_ownsMemory = true;
        delta_q.m_data = (float *)0x0;
        delta_q.m_size = 0;
        delta_q.m_capacity = 0;
        delta_qd._0_4_ = 0;
        btAlignedObjectArray<float>::resize(&delta_q,iVar10,(float *)&delta_qd);
        delta_qd.m_ownsMemory = true;
        delta_qd.m_data = (float *)0x0;
        delta_qd.m_size = 0;
        delta_qd.m_capacity = 0;
        local_124 = 0.0;
        btAlignedObjectArray<float>::resize(&delta_qd,iVar10,&local_124);
        pbVar1 = (btScalar *)(lVar15 * 4 + 0x18);
        for (uVar13 = 0; uVar14 != uVar13; uVar13 = uVar13 + 1) {
          pbVar2 = (pBody->m_basePos).m_floats + (uVar13 - 6);
          pbVar3 = pbVar2 + lVar15 * 2 + 0xc;
          delta_q.m_data[uVar13] =
               (pbVar2[lVar15 * 2 + 0xc] + pbVar2[lVar15 * 2 + 0xc] +
                pbVar2[lVar15 + 6] + pbVar2[lVar15 + 6] + *pbVar2 + pbVar3[lVar15 + 6]) * (dt / 6.0)
          ;
          delta_qd.m_data[uVar13] =
               (*(float *)((long)pbVar1 + (long)(pbVar3 + lVar15 * 3 + 0x12)) +
                *(float *)((long)pbVar1 + (long)(pbVar3 + lVar15 * 3 + 0x12)) +
                *(float *)((long)pbVar1 + (long)(pbVar3 + lVar15 * 2 + 0xc)) +
                *(float *)((long)pbVar1 + (long)(pbVar3 + lVar15 * 2 + 0xc)) +
                pbVar3[lVar15 * 2 + 0xc] +
               *(float *)((long)pbVar1 + (long)(pbVar3 + lVar15 * 4 + 0x18))) * (dt / 6.0);
        }
        solveConstraints::anon_struct_1_0_00000001::operator()
                  ((anon_struct_1_0_00000001 *)pbVar7,pBody,pbVar1);
        btMultiBody::applyDeltaVeeMultiDof(pbVar7,delta_qd.m_data,1.0);
        iVar10 = pbVar7->m_dofCount;
        pfVar9 = (pbVar7->m_realBuf).m_data;
        for (uVar13 = 0; uVar14 != uVar13; uVar13 = uVar13 + 1) {
          pfVar9[(long)(iVar10 + iVar10 * iVar10 + 6) + uVar13] = delta_q.m_data[uVar13];
        }
        pbVar7->__posUpdated = true;
        lVar15 = 0;
        for (lVar17 = 0; lVar17 < (pbVar7->m_links).m_size; lVar17 = lVar17 + 1) {
          btMultibodyLink::updateCacheMultiDof
                    ((btMultibodyLink *)
                     ((long)(((pbVar7->m_links).m_data)->m_inertiaLocal).m_floats + lVar15 + -4),
                     (btScalar *)0x0);
          lVar15 = lVar15 + 600;
        }
        btMultiBody::computeAccelerationsArticulatedBodyAlgorithmMultiDof
                  (pbVar7,0.0,&scratch_r,&scratch_v,&scratch_m,false);
        btAlignedObjectArray<float>::~btAlignedObjectArray(&delta_qd);
        btAlignedObjectArray<float>::~btAlignedObjectArray(&delta_q);
        btAlignedObjectArray<float>::~btAlignedObjectArray(&scratch_r2);
      }
    }
    lVar16 = lVar16 + 1;
  }
  CProfileSample::~CProfileSample(&__profile_1);
  (*(this->super_btDiscreteDynamicsWorld).super_btDynamicsWorld.super_btCollisionWorld.
    _vptr_btCollisionWorld[0x38])(this);
  MultiBodyInplaceSolverIslandCallback::processConstraints(this->m_solverMultiBodyIslandCallback);
  pbVar6 = (this->super_btDiscreteDynamicsWorld).m_constraintSolver;
  (*pbVar6->_vptr_btConstraintSolver[4])
            (pbVar6,solverInfo,
             (this->super_btDiscreteDynamicsWorld).super_btDynamicsWorld.super_btCollisionWorld.
             m_debugDrawer);
  CProfileManager::Start_Profile("btMultiBody stepVelocities");
  for (lVar16 = 0; lVar16 < (this->m_multiBodies).m_size; lVar16 = lVar16 + 1) {
    pbVar7 = (this->m_multiBodies).m_data[lVar16];
    if (pbVar7->m_baseCollider == (btMultiBodyLinkCollider *)0x0) {
      bVar18 = false;
    }
    else {
      bVar18 = *(int *)(pbVar7->m_baseCollider + 0xec) == 2;
    }
    uVar4 = (pbVar7->m_links).m_size;
    uVar14 = 0;
    if (0 < (int)uVar4) {
      uVar14 = (ulong)uVar4;
    }
    for (lVar15 = 0; uVar14 * 600 - lVar15 != 0; lVar15 = lVar15 + 600) {
      lVar17 = *(long *)((long)((pbVar7->m_links).m_data)->m_jointTorque + lVar15 + 0x1c);
      if (lVar17 != 0) {
        bVar18 = (bool)(bVar18 | *(int *)(lVar17 + 0xec) == 2);
      }
    }
    if (!bVar18) {
      scratch_r2._0_4_ = 0;
      btAlignedObjectArray<float>::resize(&scratch_r,uVar4 + 1,(float *)&scratch_r2);
      btAlignedObjectArray<btVector3>::resize
                (&scratch_v,(pbVar7->m_links).m_size + 1,(btVector3 *)&scratch_r2);
      btAlignedObjectArray<btMatrix3x3>::resize
                (&scratch_m,(pbVar7->m_links).m_size + 1,(btMatrix3x3 *)&scratch_r2);
      if (pbVar7->m_useRK4 == false) {
        btMultiBody::computeAccelerationsArticulatedBodyAlgorithmMultiDof
                  (pbVar7,(solverInfo->super_btContactSolverInfoData).m_timeStep,&scratch_r,
                   &scratch_v,&scratch_m,true);
      }
    }
  }
  CProfileSample::~CProfileSample((CProfileSample *)&delta_q);
  for (lVar16 = 0; lVar16 < (this->m_multiBodies).m_size; lVar16 = lVar16 + 1) {
    btMultiBody::processDeltaVeeMultiDof2((this->m_multiBodies).m_data[lVar16]);
  }
  CProfileSample::~CProfileSample(&__profile);
  btAlignedObjectArray<btMatrix3x3>::~btAlignedObjectArray(&scratch_m);
  btAlignedObjectArray<btVector3>::~btAlignedObjectArray(&scratch_v);
  btAlignedObjectArray<float>::~btAlignedObjectArray(&scratch_r);
  return;
}

Assistant:

void	btMultiBodyDynamicsWorld::solveConstraints(btContactSolverInfo& solverInfo)
{
	forwardKinematics();

	btAlignedObjectArray<btScalar> scratch_r;
	btAlignedObjectArray<btVector3> scratch_v;
	btAlignedObjectArray<btMatrix3x3> scratch_m;


	BT_PROFILE("solveConstraints");
	
	m_sortedConstraints.resize( m_constraints.size());
	int i; 
	for (i=0;i<getNumConstraints();i++)
	{
		m_sortedConstraints[i] = m_constraints[i];
	}
	m_sortedConstraints.quickSort(btSortConstraintOnIslandPredicate2());
	btTypedConstraint** constraintsPtr = getNumConstraints() ? &m_sortedConstraints[0] : 0;

	m_sortedMultiBodyConstraints.resize(m_multiBodyConstraints.size());
	for (i=0;i<m_multiBodyConstraints.size();i++)
	{
		m_sortedMultiBodyConstraints[i] = m_multiBodyConstraints[i];
	}
	m_sortedMultiBodyConstraints.quickSort(btSortMultiBodyConstraintOnIslandPredicate());

	btMultiBodyConstraint** sortedMultiBodyConstraints = m_sortedMultiBodyConstraints.size() ?  &m_sortedMultiBodyConstraints[0] : 0;
	

	m_solverMultiBodyIslandCallback->setup(&solverInfo,constraintsPtr,m_sortedConstraints.size(),sortedMultiBodyConstraints,m_sortedMultiBodyConstraints.size(), getDebugDrawer());
	m_constraintSolver->prepareSolve(getCollisionWorld()->getNumCollisionObjects(), getCollisionWorld()->getDispatcher()->getNumManifolds());
	
	/// solve all the constraints for this island
	m_islandManager->buildAndProcessIslands(getCollisionWorld()->getDispatcher(),getCollisionWorld(),m_solverMultiBodyIslandCallback);

#ifndef BT_USE_VIRTUAL_CLEARFORCES_AND_GRAVITY
	{
		BT_PROFILE("btMultiBody addForce");
		for (int i=0;i<this->m_multiBodies.size();i++)
		{
			btMultiBody* bod = m_multiBodies[i];

			bool isSleeping = false;
			
			if (bod->getBaseCollider() && bod->getBaseCollider()->getActivationState() == ISLAND_SLEEPING)
			{
				isSleeping = true;
			} 
			for (int b=0;b<bod->getNumLinks();b++)
			{
				if (bod->getLink(b).m_collider && bod->getLink(b).m_collider->getActivationState()==ISLAND_SLEEPING)
					isSleeping = true;
			} 

			if (!isSleeping)
			{
				//useless? they get resized in stepVelocities once again (AND DIFFERENTLY)
				scratch_r.resize(bod->getNumLinks()+1);			//multidof? ("Y"s use it and it is used to store qdd)
				scratch_v.resize(bod->getNumLinks()+1);
				scratch_m.resize(bod->getNumLinks()+1);

				bod->addBaseForce(m_gravity * bod->getBaseMass());

				for (int j = 0; j < bod->getNumLinks(); ++j) 
				{
					bod->addLinkForce(j, m_gravity * bod->getLinkMass(j));
				}
			}//if (!isSleeping)
		}
	}
#endif //BT_USE_VIRTUAL_CLEARFORCES_AND_GRAVITY
	

	{
		BT_PROFILE("btMultiBody stepVelocities");
		for (int i=0;i<this->m_multiBodies.size();i++)
		{
			btMultiBody* bod = m_multiBodies[i];

			bool isSleeping = false;
			
			if (bod->getBaseCollider() && bod->getBaseCollider()->getActivationState() == ISLAND_SLEEPING)
			{
				isSleeping = true;
			} 
			for (int b=0;b<bod->getNumLinks();b++)
			{
				if (bod->getLink(b).m_collider && bod->getLink(b).m_collider->getActivationState()==ISLAND_SLEEPING)
					isSleeping = true;
			} 

			if (!isSleeping)
			{
				//useless? they get resized in stepVelocities once again (AND DIFFERENTLY)
				scratch_r.resize(bod->getNumLinks()+1);			//multidof? ("Y"s use it and it is used to store qdd)
				scratch_v.resize(bod->getNumLinks()+1);
				scratch_m.resize(bod->getNumLinks()+1);
				bool doNotUpdatePos = false;

				{
					if(!bod->isUsingRK4Integration())
					{
						bod->computeAccelerationsArticulatedBodyAlgorithmMultiDof(solverInfo.m_timeStep, scratch_r, scratch_v, scratch_m);
					}
					else
					{						
						//
						int numDofs = bod->getNumDofs() + 6;
						int numPosVars = bod->getNumPosVars() + 7;
						btAlignedObjectArray<btScalar> scratch_r2; scratch_r2.resize(2*numPosVars + 8*numDofs);
						//convenience
						btScalar *pMem = &scratch_r2[0];
						btScalar *scratch_q0 = pMem; pMem += numPosVars;
						btScalar *scratch_qx = pMem; pMem += numPosVars;
						btScalar *scratch_qd0 = pMem; pMem += numDofs;
						btScalar *scratch_qd1 = pMem; pMem += numDofs;
						btScalar *scratch_qd2 = pMem; pMem += numDofs;
						btScalar *scratch_qd3 = pMem; pMem += numDofs;
						btScalar *scratch_qdd0 = pMem; pMem += numDofs;
						btScalar *scratch_qdd1 = pMem; pMem += numDofs;
						btScalar *scratch_qdd2 = pMem; pMem += numDofs;
						btScalar *scratch_qdd3 = pMem; pMem += numDofs;
						btAssert((pMem - (2*numPosVars + 8*numDofs)) == &scratch_r2[0]);

						/////						
						//copy q0 to scratch_q0 and qd0 to scratch_qd0
						scratch_q0[0] = bod->getWorldToBaseRot().x();
						scratch_q0[1] = bod->getWorldToBaseRot().y();
						scratch_q0[2] = bod->getWorldToBaseRot().z();
						scratch_q0[3] = bod->getWorldToBaseRot().w();
						scratch_q0[4] = bod->getBasePos().x();
						scratch_q0[5] = bod->getBasePos().y();
						scratch_q0[6] = bod->getBasePos().z();
						//
						for(int link = 0; link < bod->getNumLinks(); ++link)
						{
							for(int dof = 0; dof < bod->getLink(link).m_posVarCount; ++dof)
								scratch_q0[7 + bod->getLink(link).m_cfgOffset + dof] = bod->getLink(link).m_jointPos[dof];							
						}
						//
						for(int dof = 0; dof < numDofs; ++dof)								
							scratch_qd0[dof] = bod->getVelocityVector()[dof];
						////
						struct
						{
						    btMultiBody *bod;
                            btScalar *scratch_qx, *scratch_q0;

						    void operator()()
						    {
						        for(int dof = 0; dof < bod->getNumPosVars() + 7; ++dof)
                                    scratch_qx[dof] = scratch_q0[dof];
						    }
						} pResetQx = {bod, scratch_qx, scratch_q0};
						//
						struct
						{
						    void operator()(btScalar dt, const btScalar *pDer, const btScalar *pCurVal, btScalar *pVal, int size)
						    {
						        for(int i = 0; i < size; ++i)
                                    pVal[i] = pCurVal[i] + dt * pDer[i];
						    }

						} pEulerIntegrate;
						//
						struct
                        {
                            void operator()(btMultiBody *pBody, const btScalar *pData)
                            {
                                btScalar *pVel = const_cast<btScalar*>(pBody->getVelocityVector());

                                for(int i = 0; i < pBody->getNumDofs() + 6; ++i)
                                    pVel[i] = pData[i];

                            }
                        } pCopyToVelocityVector;
						//
                        struct
						{
						    void operator()(const btScalar *pSrc, btScalar *pDst, int start, int size)
						    {
						        for(int i = 0; i < size; ++i)
                                    pDst[i] = pSrc[start + i];
						    }
						} pCopy;
						//

						btScalar h = solverInfo.m_timeStep;
						#define output &scratch_r[bod->getNumDofs()]
						//calc qdd0 from: q0 & qd0	
						bod->computeAccelerationsArticulatedBodyAlgorithmMultiDof(0., scratch_r, scratch_v, scratch_m);
						pCopy(output, scratch_qdd0, 0, numDofs);
						//calc q1 = q0 + h/2 * qd0
						pResetQx();
						bod->stepPositionsMultiDof(btScalar(.5)*h, scratch_qx, scratch_qd0);
						//calc qd1 = qd0 + h/2 * qdd0
						pEulerIntegrate(btScalar(.5)*h, scratch_qdd0, scratch_qd0, scratch_qd1, numDofs);
						//
						//calc qdd1 from: q1 & qd1
						pCopyToVelocityVector(bod, scratch_qd1);
						bod->computeAccelerationsArticulatedBodyAlgorithmMultiDof(0., scratch_r, scratch_v, scratch_m);
						pCopy(output, scratch_qdd1, 0, numDofs);
						//calc q2 = q0 + h/2 * qd1
						pResetQx();
						bod->stepPositionsMultiDof(btScalar(.5)*h, scratch_qx, scratch_qd1);
						//calc qd2 = qd0 + h/2 * qdd1
						pEulerIntegrate(btScalar(.5)*h, scratch_qdd1, scratch_qd0, scratch_qd2, numDofs);
						//
						//calc qdd2 from: q2 & qd2
						pCopyToVelocityVector(bod, scratch_qd2);
						bod->computeAccelerationsArticulatedBodyAlgorithmMultiDof(0., scratch_r, scratch_v, scratch_m);
						pCopy(output, scratch_qdd2, 0, numDofs);
						//calc q3 = q0 + h * qd2
						pResetQx();
						bod->stepPositionsMultiDof(h, scratch_qx, scratch_qd2);
						//calc qd3 = qd0 + h * qdd2
						pEulerIntegrate(h, scratch_qdd2, scratch_qd0, scratch_qd3, numDofs);
						//
						//calc qdd3 from: q3 & qd3
						pCopyToVelocityVector(bod, scratch_qd3);
						bod->computeAccelerationsArticulatedBodyAlgorithmMultiDof(0., scratch_r, scratch_v, scratch_m);
						pCopy(output, scratch_qdd3, 0, numDofs);

						//
						//calc q = q0 + h/6(qd0 + 2*(qd1 + qd2) + qd3)
						//calc qd = qd0 + h/6(qdd0 + 2*(qdd1 + qdd2) + qdd3)						
						btAlignedObjectArray<btScalar> delta_q; delta_q.resize(numDofs);
						btAlignedObjectArray<btScalar> delta_qd; delta_qd.resize(numDofs);
						for(int i = 0; i < numDofs; ++i)
						{
							delta_q[i] = h/btScalar(6.)*(scratch_qd0[i] + 2*scratch_qd1[i] + 2*scratch_qd2[i] + scratch_qd3[i]);
							delta_qd[i] = h/btScalar(6.)*(scratch_qdd0[i] + 2*scratch_qdd1[i] + 2*scratch_qdd2[i] + scratch_qdd3[i]);							
							//delta_q[i] = h*scratch_qd0[i];
							//delta_qd[i] = h*scratch_qdd0[i];
						}
						//
						pCopyToVelocityVector(bod, scratch_qd0);
						bod->applyDeltaVeeMultiDof(&delta_qd[0], 1);						
						//
						if(!doNotUpdatePos)
						{
							btScalar *pRealBuf = const_cast<btScalar *>(bod->getVelocityVector());
							pRealBuf += 6 + bod->getNumDofs() + bod->getNumDofs()*bod->getNumDofs();

							for(int i = 0; i < numDofs; ++i)
								pRealBuf[i] = delta_q[i];

							//bod->stepPositionsMultiDof(1, 0, &delta_q[0]);
							bod->setPosUpdated(true);							
						}

						//ugly hack which resets the cached data to t0 (needed for constraint solver)
						{
							for(int link = 0; link < bod->getNumLinks(); ++link)
								bod->getLink(link).updateCacheMultiDof();
							bod->computeAccelerationsArticulatedBodyAlgorithmMultiDof(0, scratch_r, scratch_v, scratch_m);
						}
						
					}
				}
				
#ifndef BT_USE_VIRTUAL_CLEARFORCES_AND_GRAVITY
				bod->clearForcesAndTorques();
#endif //BT_USE_VIRTUAL_CLEARFORCES_AND_GRAVITY
			}//if (!isSleeping)
		}
	}

	clearMultiBodyConstraintForces();

	m_solverMultiBodyIslandCallback->processConstraints();
	
	m_constraintSolver->allSolved(solverInfo, m_debugDrawer);

	{
                BT_PROFILE("btMultiBody stepVelocities");
                for (int i=0;i<this->m_multiBodies.size();i++)
                {
                        btMultiBody* bod = m_multiBodies[i];

                        bool isSleeping = false;

                        if (bod->getBaseCollider() && bod->getBaseCollider()->getActivationState() == ISLAND_SLEEPING)
                        {
                                isSleeping = true;
                        }
                        for (int b=0;b<bod->getNumLinks();b++)
                        {
                                if (bod->getLink(b).m_collider && bod->getLink(b).m_collider->getActivationState()==ISLAND_SLEEPING)
                                        isSleeping = true;
                        }

                        if (!isSleeping)
                        {
                                //useless? they get resized in stepVelocities once again (AND DIFFERENTLY)
                                scratch_r.resize(bod->getNumLinks()+1);                 //multidof? ("Y"s use it and it is used to store qdd)
                                scratch_v.resize(bod->getNumLinks()+1);
                                scratch_m.resize(bod->getNumLinks()+1);

                                
                            {
                                if(!bod->isUsingRK4Integration())
                                {
									bool isConstraintPass = true;
                                    bod->computeAccelerationsArticulatedBodyAlgorithmMultiDof(solverInfo.m_timeStep, scratch_r, scratch_v, scratch_m, isConstraintPass);
                                }
				}
			}
		}
	}

	for (int i=0;i<this->m_multiBodies.size();i++)
	{
		btMultiBody* bod = m_multiBodies[i];
		bod->processDeltaVeeMultiDof2();
	}

}